

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

void __thiscall Highs::invalidateSolution(Highs *this)

{
  (this->info_).super_HighsInfoStruct.primal_solution_status = 0;
  (this->info_).super_HighsInfoStruct.dual_solution_status = 0;
  (this->info_).super_HighsInfoStruct.num_primal_infeasibilities = -1;
  (this->info_).super_HighsInfoStruct.max_primal_infeasibility = INFINITY;
  (this->info_).super_HighsInfoStruct.sum_primal_infeasibilities = INFINITY;
  (this->info_).super_HighsInfoStruct.num_dual_infeasibilities = -1;
  (this->info_).super_HighsInfoStruct.max_dual_infeasibility = INFINITY;
  (this->info_).super_HighsInfoStruct.sum_dual_infeasibilities = INFINITY;
  HighsSolution::invalidate(&this->solution_);
  return;
}

Assistant:

void Highs::invalidateSolution() {
  info_.primal_solution_status = kSolutionStatusNone;
  info_.dual_solution_status = kSolutionStatusNone;
  info_.num_primal_infeasibilities = kHighsIllegalInfeasibilityCount;
  info_.max_primal_infeasibility = kHighsIllegalInfeasibilityMeasure;
  info_.sum_primal_infeasibilities = kHighsIllegalInfeasibilityMeasure;
  info_.num_dual_infeasibilities = kHighsIllegalInfeasibilityCount;
  info_.max_dual_infeasibility = kHighsIllegalInfeasibilityMeasure;
  info_.sum_dual_infeasibilities = kHighsIllegalInfeasibilityMeasure;
  this->solution_.invalidate();
}